

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.hpp
# Opt level: O0

anon_class_40_3_96b6a9c1 * __thiscall
qclab::qgates::lambda_RotationZ<std::complex<double>,double>
          (anon_class_40_3_96b6a9c1 *__return_storage_ptr__,qgates *this,Op op,double cos,double sin
          ,complex<double> *vector)

{
  undefined7 in_register_00000011;
  undefined8 local_70;
  anon_class_40_3_96b6a9c1 f;
  complex<double> lambda2;
  complex<double> lambda1;
  complex<double> *vector_local;
  double sin_local;
  double cos_local;
  Op op_local;
  
  std::complex<double>::complex((complex<double> *)(lambda2._M_value + 8),cos,-sin);
  std::complex<double>::complex((complex<double> *)(f.lambda2._M_value + 8),cos,sin);
  if ((char)this == 'C') {
    std::swap<std::complex<double>>
              ((complex<double> *)(lambda2._M_value + 8),(complex<double> *)(f.lambda2._M_value + 8)
              );
  }
  f.vector = (complex<double> *)lambda2._M_value._8_8_;
  f.lambda1._M_value._8_8_ = f.lambda2._M_value._8_8_;
  f.lambda2._M_value._0_8_ = lambda2._M_value._0_8_;
  local_70 = CONCAT71(in_register_00000011,op);
  memcpy(__return_storage_ptr__,&local_70,0x28);
  return __return_storage_ptr__;
}

Assistant:

auto lambda_RotationZ( Op op , const R cos , const R sin , T* vector ) {
    // operation
    T lambda1 = T( cos , -sin ) ;
    T lambda2 = T( cos ,  sin ) ;
    if ( op == Op::ConjTrans ) std::swap( lambda1 , lambda2 ) ;
    // matvec
    auto f = [=] ( const uint64_t a , const uint64_t b ) {
      vector[a] *= lambda1 ;
      vector[b] *= lambda2 ;
    } ;
    return f ;
  }